

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess_test.cc
# Opt level: O0

void __thiscall
RegisterSubprocessTestInterruptParentWithSigHup::RegisterSubprocessTestInterruptParentWithSigHup
          (RegisterSubprocessTestInterruptParentWithSigHup *this)

{
  RegisterSubprocessTestInterruptParentWithSigHup *this_local;
  
  RegisterTest(SubprocessTestInterruptParentWithSigHup::Create,
               "SubprocessTest.InterruptParentWithSigHup");
  return;
}

Assistant:

TEST_F(SubprocessTest, InterruptParentWithSigHup) {
  Subprocess* subproc = subprocs_.Add("kill -HUP $PPID ; sleep 1");
  ASSERT_NE((Subprocess *) 0, subproc);

  while (!subproc->Done()) {
    bool interrupted = subprocs_.DoWork();
    if (interrupted)
      return;
  }

  ASSERT_FALSE("We should have been interrupted");
}